

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.hh
# Opt level: O2

void Arguments::assign_argument(string *key,string *value)

{
  char *pcVar1;
  bool bVar2;
  time_t tVar3;
  unsigned_long uVar4;
  string extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar2 = std::operator==(key,"maze");
  if (bVar2) {
    std::operator+(&extension,&MAZE_FOLDER_abi_cxx11_,value);
    std::__cxx11::string::operator=((string *)&maze_path_abi_cxx11_,(string *)&extension);
LAB_00104fd1:
    std::__cxx11::string::~string((string *)&extension);
  }
  else {
    bVar2 = std::operator==(key,"ghost_speed");
    if (bVar2) {
      ghost_speed = std::__cxx11::stof(value,(size_t *)0x0);
      return;
    }
    bVar2 = std::operator==(key,"pacman_speed");
    if (bVar2) {
      pacman_speed = std::__cxx11::stof(value,(size_t *)0x0);
      return;
    }
    bVar2 = std::operator==(key,"ghost_afraid_speed_fraction");
    if (bVar2) {
      ghost_afraid_speed_fraction = std::__cxx11::stof(value,(size_t *)0x0);
      return;
    }
    bVar2 = std::operator==(key,"n_rounds_powerpill");
    if (bVar2) {
      n_rounds_powerpill = std::__cxx11::stoi(value,(size_t *)0x0,10);
      return;
    }
    bVar2 = std::operator==(key,"n_rounds_ghost_revive");
    if (bVar2) {
      n_rounds_ghost_revive = std::__cxx11::stoi(value,(size_t *)0x0,10);
      return;
    }
    bVar2 = std::operator==(key,"scatter_cycle_factor");
    if (bVar2) {
      scatter_cycle_factor = std::__cxx11::stof(value,(size_t *)0x0);
      return;
    }
    bVar2 = std::operator==(key,"chase_cycle_factor");
    if (bVar2) {
      chase_cycle_factor = std::__cxx11::stof(value,(size_t *)0x0);
      return;
    }
    bVar2 = std::operator==(key,"initial_scatter_cycle_rounds");
    if (bVar2) {
      initial_scatter_cycle_rounds = std::__cxx11::stoi(value,(size_t *)0x0,10);
      return;
    }
    bVar2 = std::operator==(key,"initial_chase_cycle_rounds");
    if (bVar2) {
      initial_chase_cycle_rounds = std::__cxx11::stoi(value,(size_t *)0x0,10);
      return;
    }
    bVar2 = std::operator==(key,"cycle_rounds_stdev");
    if (bVar2) {
      cycle_rounds_stdev = std::__cxx11::stof(value,(size_t *)0x0);
      return;
    }
    bVar2 = std::operator==(key,"n_rounds_between_ghosts_start");
    if (bVar2) {
      n_rounds_between_ghosts_start = std::__cxx11::stoi(value,(size_t *)0x0,10);
      return;
    }
    bVar2 = std::operator==(key,"pacman_ai_agent");
    if (bVar2) {
      bVar2 = std::operator==(value,"pathfinding");
      if (bVar2) {
        pacman_ai_agent = PATHFINDING;
        return;
      }
      bVar2 = std::operator==(value,"input");
      if (bVar2) {
        pacman_ai_agent = INPUT;
        return;
      }
      bVar2 = std::operator==(value,"random");
      if (bVar2) {
        pacman_ai_agent = RANDOM;
        return;
      }
      bVar2 = std::operator==(value,"rl");
      if (bVar2) {
        pacman_ai_agent = RL;
        return;
      }
      pcVar1 = (value->_M_dataplus)._M_p;
      if ((*pcVar1 == 'n') && (pcVar1[1] == 'n')) {
        pacman_ai_agent = NN;
        std::__cxx11::string::string((string *)&extension,".txt",(allocator *)&local_58);
        std::operator+(&local_38,"../data/neural-networks/",value);
        std::operator+(&local_58,&local_38,&extension);
        std::__cxx11::string::operator=
                  ((string *)&neural_network_path_abi_cxx11_,(string *)&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_38);
        goto LAB_00104fd1;
      }
      key = &local_58;
      std::operator+(key,"Invalid pacman AI agent name \'",value);
      std::operator+(&extension,key,"\'");
    }
    else {
      bVar2 = std::operator==(key,"plays");
      if (bVar2) {
        plays = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      bVar2 = std::operator==(key,"random_seed");
      if (bVar2) {
        bVar2 = std::operator==(value,"time");
        if (bVar2) {
          tVar3 = time((time_t *)0x0);
          random_seed = (uint)tVar3;
          return;
        }
        uVar4 = std::__cxx11::stoul(value,(size_t *)0x0,10);
        random_seed = (uint)uVar4;
        return;
      }
      bVar2 = std::operator==(key,"n_hidden_layers");
      if (bVar2) {
        n_hidden_layers = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      bVar2 = std::operator==(key,"n_hidden_neurons");
      if (bVar2) {
        n_hidden_neurons = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      bVar2 = std::operator==(key,"learning_rate");
      if (bVar2) {
        learning_rate = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"reward_pill");
      if (bVar2) {
        reward_pill = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"reward_powerpill");
      if (bVar2) {
        reward_powerpill = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"reward_kill_ghost");
      if (bVar2) {
        reward_kill_ghost = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"reward_win");
      if (bVar2) {
        reward_win = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"reward_lose");
      if (bVar2) {
        reward_lose = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"reward_reverse");
      if (bVar2) {
        reward_reverse = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"reward_step");
      if (bVar2) {
        reward_step = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"discount_factor");
      if (bVar2) {
        discount_factor = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"smart_exploration");
      if (bVar2) {
        smart_exploration = stob(value);
        return;
      }
      bVar2 = std::operator==(key,"safe_distance_margin");
      if (bVar2) {
        safe_distance_margin = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      bVar2 = std::operator==(key,"max_intersection_distance");
      if (bVar2) {
        max_intersection_distance = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      bVar2 = std::operator==(key,"logging_statistics_precision");
      if (bVar2) {
        logging_statistics_precision = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      bVar2 = std::operator==(key,"logging_update_rate");
      if (bVar2) {
        logging_update_rate = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      bVar2 = std::operator==(key,"n_games_test");
      if (bVar2) {
        n_games_test = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      bVar2 = std::operator==(key,"show_inputs");
      if (bVar2) {
        show_inputs = stob(value);
        return;
      }
      bVar2 = std::operator==(key,"visualization_speed");
      if (bVar2) {
        visualization_speed = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"test_statistics_precision");
      if (bVar2) {
        test_statistics_precision = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      bVar2 = std::operator==(key,"non_interactive");
      if (bVar2) {
        non_interactive = stob(value);
        return;
      }
      bVar2 = std::operator==(key,"nn_evaluation_start");
      if (bVar2) {
        nn_evaluation_start = std::__cxx11::stod(value,(size_t *)0x0);
        return;
      }
      bVar2 = std::operator==(key,"nn_evaluation_attribute");
      if (!bVar2) goto LAB_00105738;
      bVar2 = std::operator==(value,"wins");
      if (bVar2) {
        nn_evaluation_attribute = WINS;
        return;
      }
      bVar2 = std::operator==(value,"completion");
      if (bVar2) {
        nn_evaluation_attribute = COMPLETION;
        return;
      }
      key = &local_58;
      std::operator+(key,"Invalid neural network evaluation attribute name \'",value);
      std::operator+(&extension,key,"\'");
    }
    while( true ) {
      while( true ) {
        while( true ) {
          error(&extension);
LAB_00105738:
          bVar2 = std::operator==(key,"exploration_strategy");
          if (!bVar2) break;
          std::__cxx11::string::substr((ulong)&extension,(ulong)value);
          bVar2 = std::operator==(&extension,"annealing");
          std::__cxx11::string::~string((string *)&extension);
          if (bVar2) {
            exploration_strategy = ANNEALING;
            return;
          }
          std::__cxx11::string::substr((ulong)&extension,(ulong)value);
          bVar2 = std::operator==(&extension,"epsilon");
          std::__cxx11::string::~string((string *)&extension);
          if (bVar2) {
            exploration_strategy = EPSILON;
            return;
          }
          key = &local_58;
          std::operator+(key,"Invalid exploration strategy attribute name \'",value);
          std::operator+(&extension,key,"\'");
        }
        bVar2 = std::operator==(key,"exploration_annealing_min_progression");
        if (bVar2) {
          exploration_annealing_min_progression = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        bVar2 = std::operator==(key,"exploration_annealing_max_progression");
        if (bVar2) {
          exploration_annealing_max_progression = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        bVar2 = std::operator==(key,"exploration_epsilon");
        if (bVar2) {
          exploration_epsilon = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        bVar2 = std::operator==(key,"exploration_epsilon_stop_progression");
        if (bVar2) {
          exploration_epsilon_stop_progression = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        bVar2 = std::operator==(key,"activation_function");
        if (!bVar2) break;
        bVar2 = std::operator==(value,"sigmoid");
        if (bVar2) {
          activation_function = SIGMOID;
          return;
        }
        bVar2 = std::operator==(value,"relu");
        if (bVar2) {
          activation_function = RELU;
          return;
        }
        key = &local_58;
        std::operator+(key,"Invalid activation function name \'",value);
        std::operator+(&extension,key,"\'");
      }
      bVar2 = std::operator==(key,"test_sampling");
      if (bVar2) break;
      value = &local_58;
      std::operator+(value,"Invalid argument name \'",key);
      std::operator+(&extension,value,"\'");
    }
    test_sampling = std::__cxx11::stoi(value,(size_t *)0x0,10);
  }
  return;
}

Assistant:

void Arguments::assign_argument(const string& key, const string& value) {
    if (key == "maze") Arguments::maze_path = MAZE_FOLDER + value;
    else if (key == "ghost_speed") Arguments::ghost_speed = stof(value);
    else if (key == "pacman_speed") Arguments::pacman_speed = stof(value);
    else if (key == "ghost_afraid_speed_fraction") Arguments::ghost_afraid_speed_fraction = stof(value);
    else if (key == "n_rounds_powerpill") Arguments::n_rounds_powerpill = stoi(value);
    else if (key == "n_rounds_ghost_revive") Arguments::n_rounds_ghost_revive = stoi(value);
    else if (key == "scatter_cycle_factor") Arguments::scatter_cycle_factor = stof(value);
    else if (key == "chase_cycle_factor") Arguments::chase_cycle_factor = stof(value);
    else if (key == "initial_scatter_cycle_rounds") Arguments::initial_scatter_cycle_rounds = stoi(value);
    else if (key == "initial_chase_cycle_rounds") Arguments::initial_chase_cycle_rounds = stoi(value);
    else if (key == "cycle_rounds_stdev") Arguments::cycle_rounds_stdev = stof(value);
    else if (key == "n_rounds_between_ghosts_start") Arguments::n_rounds_between_ghosts_start = stoi(value);
    else if (key == "pacman_ai_agent") {
        if (value == "pathfinding") Arguments::pacman_ai_agent = PATHFINDING;
        else if (value == "input") Arguments::pacman_ai_agent = INPUT;
        else if (value == "random") Arguments::pacman_ai_agent = RANDOM;
        else if (value == "rl") Arguments::pacman_ai_agent = RL;
        else if (value[0] == value[1] and value[1] == 'n') {
            Arguments::pacman_ai_agent = NN;
            string extension = ".txt";
            Arguments::neural_network_path = "../data/neural-networks/" + value + extension;
        }
        else error("Invalid pacman AI agent name '" + value + "'");
    }
    else if (key == "plays") Arguments::plays = stoi(value);
    else if (key == "random_seed") {
        if (value == "time") Arguments::random_seed = time(0);
        else Arguments::random_seed = stoul(value);
    }
    else if (key == "n_hidden_layers") Arguments::n_hidden_layers = stoi(value);
    else if (key == "n_hidden_neurons") Arguments::n_hidden_neurons = stoi(value);
    else if (key == "learning_rate") Arguments::learning_rate = stod(value);
    else if (key == "reward_pill") reward_pill = stod(value);
    else if (key == "reward_powerpill") reward_powerpill = stod(value);
    else if (key == "reward_kill_ghost") reward_kill_ghost = stod(value);
    else if (key == "reward_win") reward_win = stod(value);
    else if (key == "reward_lose") reward_lose = stod(value);
    else if (key == "reward_reverse") reward_reverse = stod(value);
    else if (key == "reward_step") reward_step = stod(value);
    else if (key == "discount_factor") discount_factor = stod(value);
    else if (key == "smart_exploration") smart_exploration = stob(value);
    else if (key == "safe_distance_margin") safe_distance_margin = stoi(value);
    else if (key == "max_intersection_distance") max_intersection_distance = stoi(value);
    else if (key == "logging_statistics_precision") logging_statistics_precision = stoi(value);
    else if (key == "logging_update_rate") logging_update_rate = stoi(value);
    else if (key == "n_games_test") n_games_test = stoi(value);
    else if (key == "show_inputs") show_inputs = stob(value);
    else if (key == "visualization_speed") visualization_speed = stod(value);
    else if (key == "test_statistics_precision") test_statistics_precision = stoi(value);
    else if (key == "non_interactive") non_interactive = stob(value);
    else if (key == "nn_evaluation_start") nn_evaluation_start = stod(value);
    else if (key == "nn_evaluation_attribute") {
        if (value == "wins") nn_evaluation_attribute = WINS;
        else if (value == "completion") nn_evaluation_attribute = COMPLETION;
        else error("Invalid neural network evaluation attribute name '" + value + "'");
    }
    else if (key == "exploration_strategy") {
        if (value.substr(0, 9) == "annealing") exploration_strategy = ANNEALING;
        else if (value.substr(0, 7) == "epsilon") exploration_strategy = EPSILON;
        else error("Invalid exploration strategy attribute name '" + value + "'");
    }
    else if (key == "exploration_annealing_min_progression") exploration_annealing_min_progression = stod(value);
    else if (key == "exploration_annealing_max_progression") exploration_annealing_max_progression = stod(value);
    else if (key == "exploration_epsilon") exploration_epsilon = stod(value);
    else if (key == "exploration_epsilon_stop_progression") exploration_epsilon_stop_progression = stod(value);
    else if (key == "activation_function") {
        if (value == "sigmoid") activation_function = SIGMOID;
        else if (value == "relu") activation_function = RELU;
        else error("Invalid activation function name '" + value + "'");
    }
    else if (key == "test_sampling") test_sampling = stoi(value);
    else error("Invalid argument name '" + key + "'");
}